

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

void testutil_random_fe_magnitude(secp256k1_fe *fe,int m)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong extraout_RAX;
  ulong uVar11;
  long lVar12;
  int extraout_EDX;
  ulong uVar13;
  secp256k1_fe *psVar14;
  secp256k1_fe *psVar15;
  secp256k1_fe *psVar16;
  secp256k1_fe *r;
  secp256k1_fe *r_00;
  uint64_t uVar17;
  secp256k1_fe sStack_310;
  secp256k1_fe sStack_2e0;
  secp256k1_fe *psStack_2b0;
  secp256k1_fe sStack_288;
  secp256k1_fe sStack_258;
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  uint64_t uStack_210;
  secp256k1_fe *psStack_208;
  secp256k1_fe *psStack_200;
  code *pcStack_1f8;
  secp256k1_fe sStack_1f0;
  ushort auStack_1c0 [16];
  uint16_t auStack_1a0 [16];
  uint16_t auStack_180 [16];
  ushort auStack_160 [16];
  ushort auStack_140 [16];
  ushort auStack_120 [16];
  uint16_t auStack_100 [32];
  secp256k1_fe sStack_c0;
  secp256k1_fe sStack_90;
  secp256k1_fe *psStack_60;
  ulong uStack_58;
  code *pcStack_50;
  secp256k1_fe local_48;
  
  psVar15 = &local_48;
  pcStack_50 = (code *)0x14da8d;
  uVar7 = testrand_int(m + 1);
  pcStack_50 = (code *)0x14da98;
  secp256k1_fe_normalize(fe);
  if (uVar7 == 0) {
    return;
  }
  local_48.n[4]._0_4_ = 0;
  local_48.n[4]._4_4_ = 0;
  local_48.magnitude = 0;
  local_48.n[2] = 0;
  local_48.n[3]._0_4_ = 0;
  local_48.n[3]._4_4_ = 0;
  local_48.n[0] = 0;
  local_48.n[1] = 0;
  local_48.normalized = 1;
  pcStack_50 = (code *)0x14dac5;
  secp256k1_fe_verify(&local_48);
  pcStack_50 = (code *)0x14dacd;
  secp256k1_fe_verify(&local_48);
  pcStack_50 = (code *)0x14dad7;
  secp256k1_fe_verify_magnitude(&local_48,0);
  local_48.n[0] = 0x1ffffdfffff85e;
  local_48.n[1] = 0x1ffffffffffffe - local_48.n[1];
  local_48.n[2] = 0x1ffffffffffffe - local_48.n[2];
  local_48.n[3] = 0x1ffffffffffffe - CONCAT44(local_48.n[3]._4_4_,(undefined4)local_48.n[3]);
  local_48.n[4] = 0x1fffffffffffe - CONCAT44(local_48.n[4]._4_4_,(undefined4)local_48.n[4]);
  local_48.magnitude = 1;
  local_48.normalized = 0;
  pcStack_50 = (code *)0x14db24;
  secp256k1_fe_verify(&local_48);
  psVar16 = (secp256k1_fe *)(ulong)(uVar7 - 1);
  pcStack_50 = (code *)0x14db30;
  secp256k1_fe_mul_int_unchecked(&local_48,uVar7 - 1);
  pcStack_50 = (code *)0x14db38;
  secp256k1_fe_verify(fe);
  pcStack_50 = (code *)0x14db40;
  secp256k1_fe_verify(&local_48);
  iVar8 = local_48.magnitude + fe->magnitude;
  if (iVar8 < 0x21) {
    uVar17 = fe->n[1];
    uVar5 = fe->n[2];
    uVar6 = fe->n[3];
    fe->n[0] = fe->n[0] + local_48.n[0];
    fe->n[1] = uVar17 + local_48.n[1];
    fe->n[2] = uVar5 + local_48.n[2];
    fe->n[3] = uVar6 + local_48.n[3];
    fe->n[4] = fe->n[4] + local_48.n[4];
    fe->magnitude = iVar8;
    fe->normalized = 0;
    pcStack_50 = (code *)0x14db84;
    psVar15 = fe;
    secp256k1_fe_verify(fe);
    if (fe->magnitude == uVar7) {
      return;
    }
  }
  else {
    pcStack_50 = (code *)0x14db99;
    testutil_random_fe_magnitude_cold_2();
  }
  pcStack_50 = test_fe_mul;
  testutil_random_fe_magnitude_cold_1();
  sStack_1f0.n[0] = psVar15->n[0];
  sStack_1f0.n[1] = psVar15->n[1];
  sStack_1f0.n[2] = psVar15->n[2];
  sStack_1f0.n[3] = psVar15->n[3];
  sStack_1f0.n[4] = psVar15->n[4];
  sStack_1f0.magnitude = psVar15->magnitude;
  sStack_1f0.normalized = psVar15->normalized;
  psStack_60 = fe;
  uStack_58 = (ulong)uVar7;
  if (extraout_EDX == 0) {
    pcStack_1f8 = (code *)0x14dbe2;
    pcStack_50 = (code *)&local_48;
    secp256k1_fe_mul(&sStack_1f0,&sStack_1f0,psVar16);
  }
  else {
    pcStack_1f8 = (code *)0x14dbd8;
    pcStack_50 = (code *)&local_48;
    secp256k1_fe_sqr(&sStack_1f0,&sStack_1f0);
  }
  sStack_90.n[0] = psVar15->n[0];
  sStack_90.n[1] = psVar15->n[1];
  sStack_90.n[2] = psVar15->n[2];
  sStack_90.n[3] = psVar15->n[3];
  sStack_90.n[4] = psVar15->n[4];
  sStack_90.magnitude = psVar15->magnitude;
  sStack_90.normalized = psVar15->normalized;
  sStack_c0.n[0] = psVar16->n[0];
  sStack_c0.n[1] = psVar16->n[1];
  sStack_c0.n[2] = psVar16->n[2];
  sStack_c0.n[3] = psVar16->n[3];
  sStack_c0.n[4] = psVar16->n[4];
  sStack_c0.magnitude = psVar16->magnitude;
  sStack_c0.normalized = psVar16->normalized;
  pcStack_1f8 = (code *)0x14dc2f;
  secp256k1_fe_normalize_var(&sStack_1f0);
  pcStack_1f8 = (code *)0x14dc37;
  secp256k1_fe_normalize_var(&sStack_90);
  pcStack_1f8 = (code *)0x14dc3f;
  secp256k1_fe_normalize_var(&sStack_c0);
  pcStack_1f8 = (code *)0x14dc4f;
  secp256k1_fe_get_b32((uchar *)auStack_120,&sStack_90);
  pcStack_1f8 = (code *)0x14dc5f;
  secp256k1_fe_get_b32((uchar *)auStack_140,&sStack_c0);
  pcStack_1f8 = (code *)0x14dc6f;
  secp256k1_fe_get_b32((uchar *)auStack_160,&sStack_1f0);
  lVar10 = 0x10;
  lVar12 = 0;
  do {
    uVar3 = auStack_140[lVar10 + -1];
    *(ushort *)((long)auStack_180 + lVar12) =
         auStack_120[lVar10 + -1] << 8 | auStack_120[lVar10 + -1] >> 8;
    uVar4 = auStack_160[lVar10 + -1];
    *(ushort *)((long)auStack_1a0 + lVar12) = uVar3 << 8 | uVar3 >> 8;
    *(ushort *)((long)auStack_1c0 + lVar12) = uVar4 << 8 | uVar4 >> 8;
    lVar12 = lVar12 + 2;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  pcStack_1f8 = (code *)0x14dcd0;
  mulmod256(auStack_100,auStack_180,auStack_1a0,test_fe_mul::m16);
  lVar10 = 0;
  uVar11 = extraout_RAX;
  do {
    uVar13 = uVar11 & 0xffffffff;
    bVar1 = *(byte *)((long)auStack_100 + lVar10);
    psVar15 = (secp256k1_fe *)(ulong)bVar1;
    bVar2 = *(byte *)((long)auStack_1c0 + lVar10);
    psVar16 = (secp256k1_fe *)(ulong)bVar2;
    uVar11 = (ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      uVar11 = uVar13;
    }
    iVar8 = (int)uVar11;
    if (bVar1 != bVar2) goto LAB_0014dcf8;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x20);
  iVar8 = 0;
LAB_0014dcf8:
  if (iVar8 == 0) {
    return;
  }
  pcStack_1f8 = test_sqrt;
  test_fe_mul_cold_1();
  r_00 = &sStack_288;
  psVar14 = &sStack_288;
  r = &sStack_258;
  psStack_208 = &sStack_c0;
  psStack_200 = &sStack_90;
  pcStack_1f8 = (code *)&sStack_1f0;
  uVar9 = secp256k1_fe_sqrt(r,psVar16);
  if (uVar9 == (psVar15 == (secp256k1_fe *)0x0)) {
    test_sqrt_cold_6();
LAB_0014deeb:
    test_sqrt_cold_5();
LAB_0014def0:
    test_sqrt_cold_4();
LAB_0014def5:
    r_00 = r;
    psVar14 = psVar15;
    test_sqrt_cold_3();
  }
  else {
    if (psVar15 == (secp256k1_fe *)0x0) {
      return;
    }
    secp256k1_fe_verify(&sStack_258);
    psVar16 = (secp256k1_fe *)0x1;
    secp256k1_fe_verify_magnitude(&sStack_258,1);
    sStack_288.n[0] = 0x3ffffbfffff0bc - sStack_258.n[0];
    sStack_288.n[1] = 0x3ffffffffffffc - sStack_258.n[1];
    sStack_288.n[2] = 0x3ffffffffffffc - sStack_258.n[2];
    sStack_288.n[3] = 0x3ffffffffffffc - sStack_258.n[3];
    uVar17 = 0x3fffffffffffc - sStack_258.n[4];
    sStack_288.magnitude = 2;
    sStack_288.normalized = 0;
    sStack_288.n[4] = uVar17;
    uStack_228 = sStack_288.n[2];
    uStack_220 = sStack_288.n[3];
    uStack_218 = sStack_288.n[0];
    uStack_210 = sStack_288.n[1];
    secp256k1_fe_verify(&sStack_288);
    secp256k1_fe_verify(&sStack_258);
    r = psVar15;
    secp256k1_fe_verify(psVar15);
    iVar8 = psVar15->magnitude + sStack_258.magnitude;
    if (0x20 < iVar8) goto LAB_0014deeb;
    sStack_258.n[0] = psVar15->n[0] + sStack_258.n[0];
    sStack_258.n[1] = psVar15->n[1] + sStack_258.n[1];
    sStack_258.n[2] = psVar15->n[2] + sStack_258.n[2];
    sStack_258.n[3] = psVar15->n[3] + sStack_258.n[3];
    sStack_258.n[4] = sStack_258.n[4] + psVar15->n[4];
    sStack_258.normalized = 0;
    sStack_258.magnitude = iVar8;
    secp256k1_fe_verify(&sStack_258);
    secp256k1_fe_verify(&sStack_288);
    r = psVar15;
    secp256k1_fe_verify(psVar15);
    if (0x1e < psVar15->magnitude) goto LAB_0014def0;
    sStack_288.n[0] = psVar15->n[0] + uStack_218;
    sStack_288.n[1] = psVar15->n[1] + uStack_210;
    sStack_288.n[2] = psVar15->n[2] + uStack_228;
    sStack_288.n[3] = psVar15->n[3] + uStack_220;
    sStack_288.n[4] = uVar17 + psVar15->n[4];
    sStack_288.normalized = 0;
    sStack_288.magnitude = psVar15->magnitude + 2;
    secp256k1_fe_verify(&sStack_288);
    secp256k1_fe_normalize(&sStack_258);
    secp256k1_fe_normalize(&sStack_288);
    r = &sStack_258;
    secp256k1_fe_verify(&sStack_258);
    psVar15 = &sStack_258;
    if (sStack_258.normalized == 0) goto LAB_0014def5;
    if (((sStack_258.n[1] == 0 && sStack_258.n[3] == 0) &&
        (sStack_258.n[0] == 0 && sStack_258.n[2] == 0)) && sStack_258.n[4] == 0) {
      return;
    }
    secp256k1_fe_verify(&sStack_288);
    if (sStack_288.normalized != 0) {
      psVar14 = &sStack_288;
      if (((sStack_288.n[1] == 0 && sStack_288.n[3] == 0) &&
          (sStack_288.n[0] == 0 && sStack_288.n[2] == 0)) && sStack_288.n[4] == 0) {
        return;
      }
      goto LAB_0014deff;
    }
  }
  test_sqrt_cold_2();
LAB_0014deff:
  test_sqrt_cold_1();
  psVar15 = r_00 + 2;
  psStack_2b0 = psVar14;
  testutil_random_fe_non_zero_test(psVar15);
  secp256k1_fe_sqr(&sStack_2e0,psVar15);
  secp256k1_fe_mul(&sStack_310,&sStack_2e0,psVar15);
  secp256k1_fe_mul(r_00,psVar16,&sStack_2e0);
  secp256k1_fe_mul(r_00 + 1,psVar16 + 1,&sStack_310);
  *(int *)r_00[3].n = (int)psVar16[2].n[0];
  return;
}

Assistant:

static void testutil_random_fe_magnitude(secp256k1_fe *fe, int m) {
    secp256k1_fe zero;
    int n = testrand_int(m + 1);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_set_int(&zero, 0);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}